

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O0

void __thiscall
Assimp::XFileExporter::XFileExporter
          (XFileExporter *this,aiScene *pScene,IOSystem *pIOSystem,string *path,string *file,
          ExportProperties *pProperties)

{
  locale local_58 [8];
  locale local_50 [11];
  allocator<char> local_45 [13];
  ExportProperties *local_38;
  ExportProperties *pProperties_local;
  string *file_local;
  string *path_local;
  IOSystem *pIOSystem_local;
  aiScene *pScene_local;
  XFileExporter *this_local;
  
  this->_vptr_XFileExporter = (_func_int **)&PTR__XFileExporter_01125920;
  local_38 = pProperties;
  pProperties_local = (ExportProperties *)file;
  file_local = path;
  path_local = (string *)pIOSystem;
  pIOSystem_local = (IOSystem *)pScene;
  pScene_local = (aiScene *)this;
  std::__cxx11::stringstream::stringstream((stringstream *)&this->mOutput);
  this->mProperties = local_38;
  this->mIOSystem = (IOSystem *)path_local;
  std::__cxx11::string::string((string *)&this->mPath,(string *)file_local);
  std::__cxx11::string::string((string *)&this->mFile,(string *)pProperties_local);
  this->mScene = (aiScene *)pIOSystem_local;
  this->mSceneOwned = false;
  std::__cxx11::string::string((string *)&this->startstr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->endstr,"\n",local_45);
  std::allocator<char>::~allocator(local_45);
  std::locale::locale(local_58,"C");
  std::ios::imbue(local_50);
  std::locale::~locale(local_50);
  std::locale::~locale(local_58);
  std::ios_base::precision
            ((ios_base *)(&this->mOutput + *(long *)(*(long *)&this->mOutput + -0x18)),8);
  WriteFile(this);
  return;
}

Assistant:

XFileExporter::XFileExporter(const aiScene* pScene, IOSystem* pIOSystem, const std::string& path, const std::string& file, const ExportProperties* pProperties)
        : mProperties(pProperties),
        mIOSystem(pIOSystem),
        mPath(path),
        mFile(file),
        mScene(pScene),
        mSceneOwned(false),
        endstr("\n")
{
    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    mOutput.imbue( std::locale("C") );
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    // start writing
    WriteFile();
}